

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int add_conterexample(saucy *s,sim_result *cex)

{
  int iVar1;
  void *pvVar2;
  sim_result *savedcex;
  int nins;
  int i;
  sim_result *cex_local;
  saucy *s_local;
  
  iVar1 = Abc_NtkPiNum(s->pNtk);
  cex->inVecSignature = 0;
  for (savedcex._4_4_ = 0; savedcex._4_4_ < iVar1; savedcex._4_4_ = savedcex._4_4_ + 1) {
    if (cex->inVec[savedcex._4_4_] != 0) {
      cex->inVecSignature =
           cex->inVec[savedcex._4_4_] * savedcex._4_4_ * savedcex._4_4_ + cex->inVecSignature;
      cex->inVecSignature = cex->inVecSignature ^ 0xabcd;
    }
  }
  savedcex._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(s->satCounterExamples);
    if (iVar1 <= savedcex._4_4_) {
      Vec_PtrPush(s->satCounterExamples,cex);
      bumpActivity(s,cex);
      return 1;
    }
    pvVar2 = Vec_PtrEntry(s->satCounterExamples,savedcex._4_4_);
    if (*(int *)((long)pvVar2 + 0x10) == cex->inVecSignature) break;
    savedcex._4_4_ = savedcex._4_4_ + 1;
  }
  return 0;
}

Assistant:

static int
add_conterexample(struct saucy *s, struct sim_result * cex)
{
    int i;
    int nins = Abc_NtkPiNum(s->pNtk);
    struct sim_result * savedcex;
    
    cex->inVecSignature = 0;
    for (i = 0; i < nins; i++) {
        if (cex->inVec[i]) {
            cex->inVecSignature += (cex->inVec[i] * i * i);
            cex->inVecSignature ^= 0xABCD;
        }
    }

    for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
        savedcex = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
        if (savedcex->inVecSignature == cex->inVecSignature) {
            //bumpActivity(s, savedcex);
            return 0;
        }
    }
    
    Vec_PtrPush(s->satCounterExamples, cex);
    bumpActivity(s, cex);
    return 1;
}